

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares.c
# Opt level: O2

uint64_t aom_sum_squares_2d_i16_c(int16_t *src,int src_stride,int width,int height)

{
  uint64_t uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)width;
  if (width < 1) {
    uVar2 = uVar3;
  }
  if (height < 1) {
    height = 0;
  }
  uVar1 = 0;
  for (; (int)uVar3 != height; uVar3 = (ulong)((int)uVar3 + 1)) {
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      uVar1 = uVar1 + (uint)((int)src[uVar4] * (int)src[uVar4]);
    }
    src = src + src_stride;
  }
  return uVar1;
}

Assistant:

uint64_t aom_sum_squares_2d_i16_c(const int16_t *src, int src_stride, int width,
                                  int height) {
  int r, c;
  uint64_t ss = 0;

  for (r = 0; r < height; r++) {
    for (c = 0; c < width; c++) {
      const int16_t v = src[c];
      ss += v * v;
    }
    src += src_stride;
  }

  return ss;
}